

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small.c
# Opt level: O0

small_mempool * small_mempool_search(small_alloc *alloc,size_t size)

{
  uint uVar1;
  small_mempool *pool;
  uint cls;
  size_t size_local;
  small_alloc *alloc_local;
  
  if (alloc->objsize_max < size) {
    alloc_local = (small_alloc *)0x0;
  }
  else {
    uVar1 = small_class_calc_offset_by_size(&alloc->small_class,(uint)size);
    alloc_local = (small_alloc *)(alloc->small_mempool_cache + uVar1);
  }
  return (small_mempool *)alloc_local;
}

Assistant:

static inline struct small_mempool *
small_mempool_search(struct small_alloc *alloc, size_t size)
{
	if (size > alloc->objsize_max)
		return NULL;
	unsigned cls =
		small_class_calc_offset_by_size(&alloc->small_class, size);
	struct small_mempool *pool = &alloc->small_mempool_cache[cls];
	return pool;
}